

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall ast::IfStmt::~IfStmt(IfStmt *this)

{
  IfStmt *this_local;
  
  (this->super_Stmt).super_Node._vptr_Node = (_func_int **)&PTR__IfStmt_001e13d8;
  if (this->condition != (Expr *)0x0) {
    (*(this->condition->super_Node)._vptr_Node[1])();
  }
  if (this->body != (BlockStmt *)0x0) {
    (*(this->body->super_Stmt).super_Node._vptr_Node[1])();
  }
  if (this->alternative != (BlockStmt *)0x0) {
    (*(this->alternative->super_Stmt).super_Node._vptr_Node[1])();
  }
  token::Token::~Token(&this->tok);
  Stmt::~Stmt(&this->super_Stmt);
  return;
}

Assistant:

~IfStmt(){
        delete condition;
        delete body;
        delete alternative;
    }